

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O3

void __thiscall APathFollower::Activate(APathFollower *this,AActor *activator)

{
  AInterpolationPoint *pAVar1;
  AInterpolationPoint *pAVar2;
  
  if ((this->super_AActor).field_0x499 != '\0') {
    return;
  }
  pAVar1 = (AInterpolationPoint *)(this->super_AActor).target.field_0.p;
  if (pAVar1 == (AInterpolationPoint *)0x0) {
LAB_0060ef8a:
    pAVar1 = (AInterpolationPoint *)0x0;
  }
  else if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
    (this->super_AActor).target.field_0.p = (AActor *)0x0;
    goto LAB_0060ef8a;
  }
  (this->CurrNode).field_0.p = pAVar1;
  pAVar2 = (AInterpolationPoint *)(this->super_AActor).lastenemy.field_0.p;
  if (pAVar2 != (AInterpolationPoint *)0x0) {
    if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0)
    goto LAB_0060efb2;
    (this->super_AActor).lastenemy.field_0.p = (AActor *)0x0;
  }
  pAVar2 = (AInterpolationPoint *)0x0;
LAB_0060efb2:
  (this->PrevNode).field_0.p = pAVar2;
  if (pAVar1 != (AInterpolationPoint *)0x0) {
    if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x26])(this);
      pAVar1 = (this->CurrNode).field_0.p;
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x22])
                ((pAVar1->super_AActor).__Pos.X,(pAVar1->super_AActor).__Pos.Y,
                 (pAVar1->super_AActor).__Pos.Z,this,0);
      this->Time = 0.0;
      this->HoldTime = 0;
      *(undefined2 *)&(this->super_AActor).field_0x499 = 0x101;
    }
    else {
      (this->CurrNode).field_0.p = (AInterpolationPoint *)0x0;
    }
  }
  return;
}

Assistant:

void APathFollower::Activate (AActor *activator)
{
	if (!bActive)
	{
		CurrNode = barrier_cast<AInterpolationPoint *>(target);
		PrevNode = barrier_cast<AInterpolationPoint *>(lastenemy);

		if (CurrNode != NULL)
		{
			NewNode ();
			SetOrigin (CurrNode->Pos(), false);
			Time = 0.f;
			HoldTime = 0;
			bJustStepped = true;
			bActive = true;
		}
	}
}